

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

ctmbstr tidyLocalizedStringImpl(uint messageType,languageDefinition *definition,uint plural)

{
  uint uVar1;
  uint pluralForm;
  languageDictionary *dictionary;
  int i;
  uint plural_local;
  languageDefinition *definition_local;
  uint messageType_local;
  
  uVar1 = (*definition->whichPluralForm)(plural);
  dictionary._0_4_ = 0;
  while( true ) {
    if (definition->messages[(int)dictionary].value == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
    if ((definition->messages[(int)dictionary].key == messageType) &&
       (definition->messages[(int)dictionary].pluralForm == uVar1)) break;
    dictionary._0_4_ = (int)dictionary + 1;
  }
  return definition->messages[(int)dictionary].value;
}

Assistant:

static ctmbstr tidyLocalizedStringImpl( uint messageType, languageDefinition *definition, uint plural )
{
    int i;
    languageDictionary *dictionary = &definition->messages;
    uint pluralForm = definition->whichPluralForm(plural);
    
    for (i = 0; (*dictionary)[i].value; ++i)
    {
        if ( (*dictionary)[i].key == messageType && (*dictionary)[i].pluralForm == pluralForm )
        {
            return (*dictionary)[i].value;
        }
    }
    return NULL;
}